

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeTextUsage.cpp
# Opt level: O2

int UnicodeTextUsage(int argc,char **argv)

{
  EStatusCode EVar1;
  EncryptionOptions *pEVar2;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *inFontReference;
  int iVar3;
  char *pcVar4;
  allocator<char> local_107a;
  allocator<char> local_1079;
  StringOrDoubleList textAndPos;
  string local_1048;
  undefined1 local_1028 [8];
  undefined1 local_1020 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1008 [3];
  bool local_fd0;
  string local_fc8;
  string local_fa8;
  string local_f88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f48;
  EncryptionOptions local_f28;
  PDFWriter pdfWriter;
  
  PDFWriter::PDFWriter(&pdfWriter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fc8,"UnicodeTextUsage.pdf",&local_1079);
  BuildRelativeOutputPath(&local_1048,argv,&local_fc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"UnicodeTextUsage.log",&local_107a);
  BuildRelativeOutputPath(&local_f88,argv,&local_fa8);
  iVar3 = 1;
  LogConfiguration::LogConfiguration((LogConfiguration *)&textAndPos,true,true,&local_f88);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_f28,pEVar2);
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)local_1020,&local_f28);
  local_1028._0_2_ = 0x101;
  local_fd0 = false;
  EVar1 = PDFWriter::StartPDF(&pdfWriter,&local_1048,ePDFVersion13,(LogConfiguration *)&textAndPos,
                              (PDFCreationSettings *)local_1028);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)local_1020);
  EncryptionOptions::~EncryptionOptions(&local_f28);
  std::__cxx11::string::~string
            ((string *)
             &textAndPos.
              super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev);
  std::__cxx11::string::~string((string *)&local_f88);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string((string *)&local_fc8);
  if (EVar1 != eSuccess) {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
    goto LAB_0016814c;
  }
  this = (PDFPage *)operator_new(0x2b8);
  PDFPage::PDFPage(this);
  PDFRectangle::PDFRectangle((PDFRectangle *)local_1028,0.0,0.0,595.0,842.0);
  PDFPage::SetMediaBox(this,(PDFRectangle *)local_1028);
  PDFRectangle::~PDFRectangle((PDFRectangle *)local_1028);
  inPageContext = PDFWriter::StartPageContentContext(&pdfWriter,this);
  if (inPageContext == (PageContentContext *)0x0) {
    std::operator<<((ostream *)&std::cout,"failed to create content context for page\n");
    goto LAB_0016814c;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fc8,"fonts/arial.ttf",(allocator<char> *)&local_fa8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textAndPos,argv[1],(allocator<char> *)&local_f88);
  LocalPathToFileURL((FileURL *)local_1028,(string *)&textAndPos);
  RelativeURLToLocalPath(&local_1048,(FileURL *)local_1028,&local_fc8);
  FileURL::~FileURL((FileURL *)local_1028);
  std::__cxx11::string::~string((string *)&textAndPos);
  inFontReference = PDFWriter::GetFontForFile(&pdfWriter,&local_1048,0);
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string((string *)&local_fc8);
  if (inFontReference == (PDFUsedFont *)0x0) {
    std::operator<<((ostream *)&std::cout,"Failed to create font object for arial.ttf\n");
    goto LAB_0016814c;
  }
  AbstractContentContext::BT(&inPageContext->super_AbstractContentContext);
  AbstractContentContext::k(&inPageContext->super_AbstractContentContext,0.0,0.0,0.0,1.0);
  AbstractContentContext::Tf(&inPageContext->super_AbstractContentContext,inFontReference,1.0);
  AbstractContentContext::Tm
            (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1028,anon_var_dwarf_1b99a5,(allocator<char> *)&textAndPos);
  EVar1 = AbstractContentContext::Tj
                    (&inPageContext->super_AbstractContentContext,(string *)local_1028);
  std::__cxx11::string::~string((string *)local_1028);
  if (EVar1 != eSuccess) {
    std::operator<<((ostream *)&std::cout,"Could not find some of the glyphs for this font Tj");
  }
  AbstractContentContext::Tm
            (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,562.8997);
  textAndPos.
  super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  textAndPos.
  super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&textAndPos;
  textAndPos.
  super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&textAndPos;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f48,"hell",(allocator<char> *)&local_1048);
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::SomethingOrDouble((SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1028,&local_f48);
  std::__cxx11::
  list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&textAndPos,(value_type *)local_1028);
  std::__cxx11::string::~string((string *)local_1028);
  std::__cxx11::string::~string((string *)&local_f48);
  local_1028 = (undefined1  [8])(local_1020 + 8);
  local_1020._0_8_ = (_List_node_base *)0x0;
  local_1020[8] = '\0';
  local_1008[0]._M_allocated_capacity = 0xc097700000000000;
  local_1008[0]._M_local_buf[8] = '\x01';
  std::__cxx11::
  list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&textAndPos,(value_type *)local_1028);
  std::__cxx11::string::~string((string *)local_1028);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f68,anon_var_dwarf_1b99a5 + 4,(allocator<char> *)&local_1048);
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::SomethingOrDouble((SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1028,&local_f68);
  std::__cxx11::
  list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&textAndPos,(value_type *)local_1028);
  std::__cxx11::string::~string((string *)local_1028);
  std::__cxx11::string::~string((string *)&local_f68);
  EVar1 = AbstractContentContext::TJ(&inPageContext->super_AbstractContentContext,&textAndPos);
  if (EVar1 != eSuccess) {
    std::operator<<((ostream *)&std::cout,"Could not find some of the glyphs for this font using TJ"
                   );
  }
  AbstractContentContext::ET(&inPageContext->super_AbstractContentContext);
  EVar1 = PDFWriter::EndPageContentContext(&pdfWriter,inPageContext);
  if (EVar1 == eSuccess) {
    EVar1 = PDFWriter::WritePageAndRelease(&pdfWriter,this);
    if (EVar1 != eSuccess) {
      pcVar4 = "failed to write page\n";
      goto LAB_001684e1;
    }
    EVar1 = PDFWriter::EndPDF(&pdfWriter);
    if (EVar1 != eSuccess) {
      pcVar4 = "failed in end PDF\n";
      goto LAB_001684e1;
    }
    iVar3 = 0;
  }
  else {
    pcVar4 = "failed to end page content context\n";
LAB_001684e1:
    std::operator<<((ostream *)&std::cout,pcVar4);
    iVar3 = 1;
  }
  std::__cxx11::
  _List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear(&textAndPos.
              super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            );
LAB_0016814c:
  PDFWriter::~PDFWriter(&pdfWriter);
  return iVar3;
}

Assistant:

int UnicodeTextUsage(int argc, char* argv[])
{
	PDFWriter pdfWriter;
	EStatusCode status;

	do
	{
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv,"UnicodeTextUsage.pdf"),
			ePDFVersion13,
			LogConfiguration(true, true, BuildRelativeOutputPath(argv,"UnicodeTextUsage.log")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to start PDF\n";
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0, 0, 595, 842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);
		if (NULL == contentContext)
		{
			status = PDFHummus::eFailure;
			cout << "failed to create content context for page\n";
			break;
		}

		PDFUsedFont* font = pdfWriter.GetFontForFile(
			BuildRelativeInputPath(argv,"fonts/arial.ttf"));
		if (!font)
		{
			status = PDFHummus::eFailure;
			cout << "Failed to create font object for arial.ttf\n";
			break;
		}


		// Draw some text
		contentContext->BT();
		contentContext->k(0, 0, 0, 1);

		contentContext->Tf(font, 1);

		contentContext->Tm(30, 0, 0, 30, 78.4252, 662.8997);

		EStatusCode encodingStatus = contentContext->Tj("hello \xD7\x92");
		if (encodingStatus != PDFHummus::eSuccess)
			cout << "Could not find some of the glyphs for this font Tj";

		contentContext->Tm(30, 0, 0, 30, 78.4252, 562.8997);
		StringOrDoubleList textAndPos;

		textAndPos.push_back(StringOrDouble("hell"));
		textAndPos.push_back(-50*30);
		textAndPos.push_back(StringOrDouble("o \xD7\x92"));

		encodingStatus = contentContext->TJ(textAndPos);
		if (encodingStatus != PDFHummus::eSuccess)
			cout << "Could not find some of the glyphs for this font using TJ";


		// continue even if failed...want to see how it looks like
		contentContext->ET();

		status = pdfWriter.EndPageContentContext(contentContext);
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed in end PDF\n";
			break;
		}
	} while (false);
	return status == eSuccess ? 0:1;
}